

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_elements_transaction.cpp
# Opt level: O0

ElementsNetType
cfd::api::json::ElementsTransactionJsonApi::ConvertElementsNetType(string *elements_net_type)

{
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ElementsNetType net_type;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  CfdError in_stack_ffffffffffffffac;
  CfdException *in_stack_ffffffffffffffb0;
  string local_48 [32];
  CfdSourceLocation local_28;
  ElementsNetType local_c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8;
  
  local_8 = in_RDI;
  bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    local_c = kLiquidV1;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar1) {
      bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (!bVar1) {
        bVar1 = std::operator==(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        if (!bVar1) {
          local_28.filename =
               strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/jsonapi/cfd_json_elements_transaction.cpp"
                       ,0x2f);
          local_28.filename = local_28.filename + 1;
          local_28.line = 0x1e0;
          local_28.funcname = "ConvertElementsNetType";
          core::logger::warn<std::__cxx11::string_const&>
                    (&local_28,
                     "Failed to ConvertElementsNetType. Invalid elements_network_type passed:  elements_network_type={}"
                     ,local_8);
          uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
          uVar2 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_48,
                     "Invalid elements_network_type passed. elements_network_type must be \"liquidv1\" or \"regtest\"."
                     ,(allocator *)&stack0xffffffffffffffb7);
          core::CfdException::CfdException
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                     (string *)CONCAT44(in_stack_ffffffffffffffa4,uVar3));
          __cxa_throw(uVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
    }
    local_c = kElementsRegtest;
  }
  return local_c;
}

Assistant:

ElementsNetType ElementsTransactionJsonApi::ConvertElementsNetType(
    const std::string& elements_net_type) {
  ElementsNetType net_type;
  if (elements_net_type == "liquidv1") {
    net_type = ElementsNetType::kLiquidV1;
  } else if ((elements_net_type == "elementsregtest") ||
      (elements_net_type == "liquidregtest") ||
      (elements_net_type == "regtest")) {
    net_type = ElementsNetType::kElementsRegtest;
  } else {
    warn(
        CFD_LOG_SOURCE,
        "Failed to ConvertElementsNetType. Invalid elements_network_type "
        "passed:  elements_network_type={}",  // NOLINT
        elements_net_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid elements_network_type passed. elements_network_type must be "
        "\"liquidv1\" or \"regtest\".");  // NOLINT
  }
  return net_type;
}